

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O2

void __thiscall
Js::JavascriptGenerator::JavascriptGenerator
          (JavascriptGenerator *this,DynamicType *type,Arguments *args,
          ScriptFunction *scriptFunction)

{
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01398248;
  (this->frame).ptr = (InterpreterStackFrame *)0x0;
  this->state = SuspendedStart;
  (this->args).Info = args->Info;
  (this->args).Values = args->Values;
  Memory::WriteBarrierPtr<Js::ScriptFunction>::WriteBarrierSet(&this->scriptFunction,scriptFunction)
  ;
  (this->resumeYieldObject).ptr = (DynamicObject *)0x0;
  (this->bailInSymbolsTraceArray).ptr = (BailInSymbol *)0x0;
  this->bailInSymbolsTraceArrayCount = 0;
  return;
}

Assistant:

JavascriptGenerator::JavascriptGenerator(
    DynamicType* type,
    Arguments& args,
    ScriptFunction* scriptFunction) :
        DynamicObject(type),
        args(args),
        frame(nullptr),
        state(GeneratorState::SuspendedStart),
        scriptFunction(scriptFunction),
        resumeYieldObject(nullptr) {}